

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

TemplateDictionary * anon_unknown.dwarf_4cac::GetIncludeDict(TemplateDictionary *d,char *name,int i)

{
  TemplateDictionary *pTVar1;
  int iVar2;
  TemplateDictionaryPeer peer;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateString local_28;
  
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peer.dict_ = d;
  ctemplate::TemplateString::TemplateString(&local_28,name);
  iVar2 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries(&peer,&local_28,&dicts);
  if (i <= iVar2) {
    pTVar1 = dicts.
             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ._M_impl.super__Vector_impl_data._M_start[(uint)i];
    std::
    _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::~_Vector_base(&dicts.
                     super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                   );
    return pTVar1;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","peer.GetIncludeDictionaries(name, &dicts)",">=","i");
  exit(1);
}

Assistant:

static const TemplateDictionary* GetIncludeDict(
    const TemplateDictionary* d, const char* name, int i) {
  TemplateDictionaryPeer peer(d);
  vector<const TemplateDictionary*> dicts;
  EXPECT_GE(peer.GetIncludeDictionaries(name, &dicts), i);
  return dicts[i];
}